

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateMembers
          (EnumFieldGenerator *this,Printer *printer,bool param_2)

{
  if (((this->super_FieldGenerator).params_)->generate_intdefs_ == true) {
    io::Printer::Print(printer,&this->variables_,"$message_type_intdef$\n");
  }
  io::Printer::Print(printer,&this->variables_,"public $type$ $name$;\n");
  if (((this->super_FieldGenerator).params_)->generate_has_ == true) {
    io::Printer::Print(printer,&this->variables_,"public boolean has$capitalized_name$;\n");
    return;
  }
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMembers(io::Printer* printer, bool /* unused lazy_init */) const {
  if (params_.generate_intdefs()) {
    printer->Print(variables_, "$message_type_intdef$\n");
  }
  printer->Print(variables_, "public $type$ $name$;\n");

  if (params_.generate_has()) {
    printer->Print(variables_,
      "public boolean has$capitalized_name$;\n");
  }
}